

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_slider.cpp
# Opt level: O3

void QtMWidgets::Slider::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  QColor *pQVar4;
  
  if (_c == WriteProperty) {
    pQVar4 = (QColor *)*_a;
    if (_id == 2) {
      setGrooveHeight((Slider *)_o,pQVar4->cspec);
      return;
    }
    if (_id == 1) {
      setHighlightColor((Slider *)_o,pQVar4);
      return;
    }
    if (_id == 0) {
      setHandleRadius((Slider *)_o,pQVar4->cspec);
      return;
    }
  }
  else if (_c == ReadProperty) {
    piVar1 = (int *)*_a;
    if (_id == 2) {
      iVar3 = grooveHeight((Slider *)_o);
    }
    else {
      if (_id == 1) {
        pQVar4 = highlightColor((Slider *)_o);
        uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
        *(undefined8 *)piVar1 = *(undefined8 *)pQVar4;
        *(undefined8 *)((long)piVar1 + 6) = uVar2;
        return;
      }
      if (_id != 0) {
        return;
      }
      iVar3 = handleRadius((Slider *)_o);
    }
    *piVar1 = iVar3;
  }
  return;
}

Assistant:

void QtMWidgets::Slider::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Slider *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->handleRadius(); break;
        case 1: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->grooveHeight(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Slider *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHandleRadius(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        case 2: _t->setGrooveHeight(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}